

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

InsideExpression * __thiscall
slang::BumpAllocator::
emplace<slang::ast::InsideExpression,slang::ast::Type_const&,slang::ast::Expression_const&,nonstd::span_lite::span<slang::ast::Expression_const*,18446744073709551615ul>,slang::SourceRange>
          (BumpAllocator *this,Type *args,Expression *args_1,
          span<const_slang::ast::Expression_*,_18446744073709551615UL> *args_2,SourceRange *args_3)

{
  span<const_slang::ast::Expression_*,_18446744073709551615UL> *left;
  Expression *type;
  InsideExpression *this_00;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> local_40;
  SourceRange *local_30;
  SourceRange *args_local_3;
  span<const_slang::ast::Expression_*,_18446744073709551615UL> *args_local_2;
  Expression *args_local_1;
  Type *args_local;
  BumpAllocator *this_local;
  
  local_30 = args_3;
  args_local_3 = (SourceRange *)args_2;
  args_local_2 = (span<const_slang::ast::Expression_*,_18446744073709551615UL> *)args_1;
  args_local_1 = (Expression *)args;
  args_local = (Type *)this;
  this_00 = (InsideExpression *)allocate(this,0x48,8);
  type = args_local_1;
  left = args_local_2;
  nonstd::span_lite::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::
  span<const_slang::ast::Expression_*,_18446744073709551615UL,_0>
            (&local_40,(span<const_slang::ast::Expression_*,_18446744073709551615UL> *)args_local_3)
  ;
  ast::InsideExpression::InsideExpression
            (this_00,(Type *)type,(Expression *)left,local_40,*local_30);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }